

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::internal::String::FormatHexInt_abi_cxx11_(int value)

{
  void *pvVar1;
  int in_ESI;
  string *in_RDI;
  stringstream ss;
  stringstream local_198 [16];
  undefined1 local_188 [380];
  int local_c;
  
  local_c = in_ESI;
  std::__cxx11::stringstream::stringstream(local_198);
  pvVar1 = (void *)std::ostream::operator<<(local_188,std::hex);
  pvVar1 = (void *)std::ostream::operator<<(pvVar1,std::uppercase);
  std::ostream::operator<<(pvVar1,local_c);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

std::string String::FormatHexInt(int value) {
  std::stringstream ss;
  ss << std::hex << std::uppercase << value;
  return ss.str();
}